

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O1

void chan_writec0(opl_channel *channel,Bit8u data)

{
  byte bVar1;
  Bit8u *pBVar2;
  opl_channel *channel_00;
  
  channel->fb = data >> 1 & 7;
  bVar1 = data & 1;
  channel->con = bVar1;
  channel->alg = bVar1;
  channel_00 = channel;
  if (channel->chip->newm != '\0') {
    if (channel->chtype == '\x02') {
      channel->alg = channel->pair->con * '\x02' | bVar1 | 4;
      pBVar2 = &channel->pair->alg;
    }
    else {
      if (channel->chtype != '\x01') goto LAB_00322a3c;
      pBVar2 = &channel->alg;
      channel_00 = channel->pair;
      channel_00->alg = bVar1 * '\x02' | channel_00->con | 4;
    }
    *pBVar2 = '\b';
  }
LAB_00322a3c:
  chan_setupalg(channel_00);
  if (channel->chip->newm == '\0') {
    channel->cha = 0xffff;
    channel->chb = 0xffff;
  }
  else {
    channel->cha = (Bit16u)((int)((uint)data << 0x1b) >> 0x1f);
    channel->chb = (Bit16u)((int)((uint)data << 0x1a) >> 0x1f);
  }
  return;
}

Assistant:

void chan_writec0(opl_channel *channel, Bit8u data) {
	channel->fb = (data & 0x0e) >> 1;
	channel->con = data & 0x01;
	channel->alg = channel->con;
	if (channel->chip->newm) {
		if (channel->chtype == ch_4op) {
			channel->pair->alg = 0x04 | (channel->con << 1) | (channel->pair->con);
			channel->alg = 0x08;
			chan_setupalg(channel->pair);
		}
		else if (channel->chtype == ch_4op2) {
			channel->alg = 0x04 | (channel->pair->con << 1) | (channel->con);
			channel->pair->alg = 0x08;
			chan_setupalg(channel);
		}
		else {
			chan_setupalg(channel);
		}
	}
	else {
		chan_setupalg(channel);
	}
	if (channel->chip->newm) {
		channel->cha = ((data >> 4) & 0x01) ? ~0 : 0;
		channel->chb = ((data >> 5) & 0x01) ? ~0 : 0;
	}
	else {
		channel->cha = channel->chb = ~0;
	}
}